

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O1

UriType * __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetUri(UriType *__return_storage_ptr__,
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *root,UriType *rootUri,size_t *unresolvedTokenIndex,CrtAllocator *allocator)

{
  ushort uVar1;
  SizeType index;
  Data *pDVar2;
  Data *pDVar3;
  ushort uVar4;
  Ch *pCVar5;
  long lVar6;
  Token *pTVar7;
  MemberIterator m;
  UriType base;
  UriType here;
  Ch *local_130;
  size_t *local_128;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *local_120;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_118;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_c8;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_78;
  
  if (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
      ::
      GetUri(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>&,rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>const&,unsigned_long*,rapidjson::CrtAllocator*)
      ::kIdValue == '\0') {
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::GetUri();
  }
  local_118.path_ = (Ch *)0x0;
  local_118.query_ = (Ch *)0x0;
  local_118.scheme_ = (Ch *)0x0;
  local_118.auth_ = (Ch *)0x0;
  local_118.uri_ = (Ch *)0x0;
  local_118.base_ = (Ch *)0x0;
  local_118.frag_ = (Ch *)0x0;
  local_118.ownAllocator_ = (CrtAllocator *)0x0;
  local_128 = unresolvedTokenIndex;
  local_118.allocator_ = allocator;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::operator=(&local_118,rootUri);
  if (this->parseErrorCode_ != kPointerParseErrorNone) {
    __assert_fail("IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x220,
                  "UriType rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::GetUri(ValueType &, const UriType &, size_t *, Allocator *) const [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->tokenCount_ != 0) {
    pTVar7 = this->tokens_;
    lVar6 = -(long)pTVar7;
    local_120 = this;
    do {
      uVar1 = (root->data_).f.flags;
      uVar4 = uVar1 & 7;
      if (uVar4 != 4) {
        if (uVar4 == 3) {
          GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          ::FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      *)&local_130,root);
          if ((root->data_).f.flags != 3) {
LAB_001280d7:
            __assert_fail("IsObject()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                          ,0x4fd,
                          "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          if ((local_130 !=
               (Ch *)((ulong)(root->data_).s.length * 0x20 +
                     ((ulong)(root->data_).s.str & 0xffffffffffff))) &&
             ((local_130[0x1f] & 4U) != 0)) {
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
            ::
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      ((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                        *)&local_78,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)(local_130 + 0x10),allocator);
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::Resolve(&local_c8,&local_78,&local_118,allocator);
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::~GenericUri(&local_78);
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::operator=(&local_118,&local_c8);
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::~GenericUri(&local_c8);
            this = local_120;
          }
          pCVar5 = pTVar7->name;
          if (pTVar7->length != 0 && pCVar5 == (Ch *)0x0) {
            __assert_fail("str != 0 || len == 0u",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                          ,0x19c,
                          "rapidjson::GenericStringRef<char>::GenericStringRef(const CharType *, SizeType) [CharType = char]"
                         );
          }
          if (pCVar5 == (Ch *)0x0) {
            pCVar5 = "";
          }
          local_c8.base_ = (Ch *)((ulong)pCVar5 | 0x405000000000000);
          local_c8.uri_ = (Ch *)(ulong)pTVar7->length;
          GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          ::FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      *)&local_78,root);
          local_130 = local_78.uri_;
          if ((root->data_).f.flags != 3) goto LAB_001280d7;
          pDVar2 = &root->data_;
          pDVar3 = &root->data_;
          root = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)(local_78.uri_ + 0x10);
          if (local_78.uri_ !=
              (Ch *)((ulong)(pDVar3->s).length * 0x20 + ((ulong)(pDVar2->s).str & 0xffffffffffff)))
          goto LAB_0012802c;
        }
LAB_00128079:
        if (local_128 != (size_t *)0x0) {
          *local_128 = -((long)&this->tokens_->name + lVar6) >> 4;
        }
        __return_storage_ptr__->path_ = (Ch *)0x0;
        __return_storage_ptr__->query_ = (Ch *)0x0;
        __return_storage_ptr__->scheme_ = (Ch *)0x0;
        __return_storage_ptr__->auth_ = (Ch *)0x0;
        __return_storage_ptr__->uri_ = (Ch *)0x0;
        __return_storage_ptr__->base_ = (Ch *)0x0;
        __return_storage_ptr__->frag_ = (Ch *)0x0;
        __return_storage_ptr__->allocator_ = allocator;
        __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
        goto LAB_001280b8;
      }
      index = pTVar7->index;
      if (index == 0xffffffff) goto LAB_00128079;
      if (uVar1 != 4) {
        __assert_fail("IsArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                      ,0x66b,
                      "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      if ((root->data_).s.length <= index) goto LAB_00128079;
      root = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](root,index);
LAB_0012802c:
      pTVar7 = pTVar7 + 1;
      lVar6 = lVar6 + -0x10;
    } while (pTVar7 != this->tokens_ + this->tokenCount_);
  }
  __return_storage_ptr__->frag_ = (Ch *)0x0;
  __return_storage_ptr__->allocator_ = (CrtAllocator *)0x0;
  __return_storage_ptr__->path_ = (Ch *)0x0;
  __return_storage_ptr__->query_ = (Ch *)0x0;
  __return_storage_ptr__->scheme_ = (Ch *)0x0;
  __return_storage_ptr__->auth_ = (Ch *)0x0;
  __return_storage_ptr__->uri_ = (Ch *)0x0;
  __return_storage_ptr__->base_ = (Ch *)0x0;
  __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::operator=(__return_storage_ptr__,&local_118);
LAB_001280b8:
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericUri(&local_118);
  return __return_storage_ptr__;
}

Assistant:

UriType GetUri(ValueType& root, const UriType& rootUri, size_t* unresolvedTokenIndex = 0, Allocator* allocator = 0) const {
        static const Ch kIdString[] = { 'i', 'd', '\0' };
        static const ValueType kIdValue(kIdString, 2);
        UriType base = UriType(rootUri, allocator);
        RAPIDJSON_ASSERT(IsValid());
        ValueType* v = &root;
        for (const Token *t = tokens_; t != tokens_ + tokenCount_; ++t) {
            switch (v->GetType()) {
                case kObjectType:
                {
                    // See if we have an id, and if so resolve with the current base
                    typename ValueType::MemberIterator m = v->FindMember(kIdValue);
                    if (m != v->MemberEnd() && (m->value).IsString()) {
                        UriType here = UriType(m->value, allocator).Resolve(base, allocator);
                        base = here;
                    }
                    m = v->FindMember(GenericValue<EncodingType>(GenericStringRef<Ch>(t->name, t->length)));
                    if (m == v->MemberEnd())
                        break;
                    v = &m->value;
                }
                  continue;
                case kArrayType:
                    if (t->index == kPointerInvalidIndex || t->index >= v->Size())
                        break;
                    v = &((*v)[t->index]);
                    continue;
                default:
                    break;
            }

            // Error: unresolved token
            if (unresolvedTokenIndex)
                *unresolvedTokenIndex = static_cast<size_t>(t - tokens_);
            return UriType(allocator);
        }
        return base;
    }